

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

string * __thiscall google::protobuf::internal::LazyString::Init_abi_cxx11_(LazyString *this)

{
  char *pcVar1;
  LazyString *pLVar2;
  
  std::mutex::lock(&Init::mu.mu_);
  pLVar2 = (LazyString *)(this->inited_)._M_b._M_p;
  if (pLVar2 == (LazyString *)0x0) {
    pcVar1 = (this->field_0).init_value_.ptr;
    (this->field_0).init_value_.ptr = (char *)((long)&this->field_0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)this,pcVar1,pcVar1 + (this->field_0).init_value_.size);
    (this->inited_)._M_b._M_p = (__pointer_type)this;
    pLVar2 = this;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&Init::mu);
  return (string *)pLVar2;
}

Assistant:

const std::string& LazyString::Init() const {
  static WrappedMutex mu{GOOGLE_PROTOBUF_LINKER_INITIALIZED};
  mu.Lock();
  const std::string* res = inited_.load(std::memory_order_acquire);
  if (res == nullptr) {
    auto init_value = init_value_;
    res = ::new (static_cast<void*>(string_buf_))
        std::string(init_value.ptr, init_value.size);
    inited_.store(res, std::memory_order_release);
  }
  mu.Unlock();
  return *res;
}